

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltForCharException.cpp
# Opt level: O0

string * __thiscall
antlr::NoViableAltForCharException::getMessage_abi_cxx11_(NoViableAltForCharException *this)

{
  string *in_RDI;
  string local_68 [20];
  int in_stack_ffffffffffffffac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
             (allocator<char> *)in_stack_ffffffffffffffb0);
  charName_abi_cxx11_(in_stack_ffffffffffffffac);
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return in_RDI;
}

Assistant:

string NoViableAltForCharException::getMessage() const
{
	return ANTLR_USE_NAMESPACE(std)string("unexpected char: ")+charName(foundChar);
}